

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenumberarea.h
# Opt level: O3

void __thiscall LineNumArea::~LineNumArea(LineNumArea *this)

{
  QWidget::~QWidget((QWidget *)&this[-1]._otherLinesColor);
  operator_delete(&this[-1]._otherLinesColor,0x58);
  return;
}

Assistant:

class LineNumArea final : public QWidget {
    Q_OBJECT

public:
    explicit LineNumArea(QMarkdownTextEdit *parent)
        : QWidget(parent),
          textEdit(parent)
    {
        Q_ASSERT(parent);

        _currentLineColor = QColor(QStringLiteral("#eef067"));
        _otherLinesColor = QColor(QStringLiteral("#a6a6a6"));
        setHidden(true);

        // We always use fixed font to avoid "width" issues
        setFont(QFontDatabase::systemFont(QFontDatabase::FixedFont));
    }

    void setCurrentLineColor(QColor color) {
        _currentLineColor = color;
    }